

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-types.c
# Opt level: O3

void fy_parse_eventp_list_recycle_all(fy_parser *fyp,fy_eventp_list *_l)

{
  list_head *plVar1;
  list_head *plVar2;
  fy_eventp *fyep;
  
  if ((_l != (fy_eventp_list *)0x0) &&
     (fyep = (fy_eventp *)(_l->_lh).next, fyep != (fy_eventp *)0x0 && fyep != (fy_eventp *)_l)) {
    do {
      plVar1 = (fyep->node).next;
      plVar2 = (fyep->node).prev;
      plVar1->prev = plVar2;
      plVar2->next = plVar1;
      (fyep->node).next = &fyep->node;
      (fyep->node).prev = &fyep->node;
      fy_parse_eventp_recycle(fyp,fyep);
      fyep = (fy_eventp *)(_l->_lh).next;
      if (fyep == (fy_eventp *)_l) {
        return;
      }
    } while (fyep != (fy_eventp *)0x0);
  }
  return;
}

Assistant:

struct fy_eventp *fy_parse_eventp_alloc(struct fy_parser *fyp) {
    struct fy_eventp *fyep;

    fyep = fy_parse_eventp_alloc_simple(fyp);
    if (!fyep)
        return NULL;
    fyep->fyp = fyp;
    fyep->e.type = FYET_NONE;

    return fyep;
}